

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Ramp.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Ramp::ArchiveIN(ChFunction_Ramp *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Ramp>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->y0;
  local_30._name = "y0";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->ang;
  local_48._name = "ang";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Ramp::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Ramp>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(y0);
    marchive >> CHNVP(ang);
}